

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.cpp
# Opt level: O2

void __thiscall
ObjectFactorySystem::GetAll
          (ObjectFactorySystem *this,IAUDynArray<IObjectConstructor_*> *constructors)

{
  pointer ppIVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  long lVar4;
  
  (*(code *)**(undefined8 **)constructors)
            (constructors,
             (long)(this->m_Constructors).
                   super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_Constructors).
                   super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  ppIVar2 = (this->m_Constructors).
            super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar3 = (this->m_Constructors).
            super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (lVar4 = 0; ppIVar1 = (pointer)((long)ppIVar2 + lVar4), ppIVar1 != ppIVar3; lVar4 = lVar4 + 8)
  {
    *(IObjectConstructor **)(*(long *)(constructors + 8) + lVar4) = *ppIVar1;
  }
  return;
}

Assistant:

void ObjectFactorySystem::GetAll(IAUDynArray<IObjectConstructor*> &constructors) const
{
	constructors.Resize(m_Constructors.size());
	std::vector<IObjectConstructor*>::const_iterator it = m_Constructors.begin();
	std::vector<IObjectConstructor*>::const_iterator itEnd = m_Constructors.end();
	for(int i = 0; it != itEnd; ++it, ++i)
	{
		constructors[i] = *it;
	}
}